

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddCompilerRequirementFlag
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang)

{
  cmMakefile *this_00;
  pointer pbVar1;
  cmake *this_01;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar6;
  mapped_type *pmVar7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __rhs;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  ostream *poVar9;
  string *psVar10;
  char *pcVar11;
  string *psVar12;
  long lVar13;
  size_t i;
  ulong uVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  optVec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  optVec_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  optVec_2;
  allocator local_269;
  string *local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string type;
  char *defaultStd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f0;
  string standard;
  string extProp;
  string stdProp;
  
  psVar12 = (string *)&optVec;
  if (lang->_M_string_length == 0) {
    return;
  }
  this_00 = this->Makefile;
  local_268 = flags;
  std::operator+(&extProp,"CMAKE_",lang);
  std::operator+(&standard,&extProp,"_STANDARD_DEFAULT");
  pcVar5 = cmMakefile::GetDefinition(this_00,&standard);
  std::__cxx11::string::~string((string *)&standard);
  std::__cxx11::string::~string((string *)&extProp);
  if (pcVar5 == (char *)0x0) {
    return;
  }
  if (*pcVar5 == '\0') {
    return;
  }
  defaultStd = pcVar5;
  std::operator+(&extProp,lang,"_EXTENSIONS");
  pcVar5 = cmGeneratorTarget::GetProperty(target,&extProp);
  if (pcVar5 == (char *)0x0) {
    bVar2 = true;
  }
  else {
    bVar2 = cmSystemTools::IsOff(pcVar5);
    bVar2 = !bVar2;
  }
  std::operator+(&stdProp,lang,"_STANDARD");
  pcVar5 = cmGeneratorTarget::GetProperty(target,&stdProp);
  if (pcVar5 == (char *)0x0) {
    if (!bVar2) goto LAB_002b4e46;
    std::operator+(&type,"CMAKE_",lang);
    std::operator+(&standard,&type,"_EXTENSION_COMPILE_OPTION");
    std::__cxx11::string::~string((string *)&type);
    pcVar5 = cmMakefile::GetDefinition(target->Target->Makefile,&standard);
    if (pcVar5 != (char *)0x0) {
      optVec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      optVec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      optVec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&type,pcVar5,(allocator *)&optVec_1);
      cmSystemTools::ExpandListArgument(&type,&optVec,false);
      std::__cxx11::string::~string((string *)&type);
      lVar13 = 0;
      for (uVar14 = 0;
          uVar14 < (ulong)((long)optVec.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)optVec.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5);
          uVar14 = uVar14 + 1) {
        (*this->_vptr_cmLocalGenerator[8])
                  (this,local_268,
                   (long)&((optVec.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar13);
        lVar13 = lVar13 + 0x20;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&optVec);
    }
    psVar12 = &standard;
  }
  else {
    pcVar11 = "STANDARD";
    if (bVar2) {
      pcVar11 = "EXTENSION";
    }
    std::__cxx11::string::string((string *)&type,pcVar11,(allocator *)&standard);
    std::operator+(&standard,lang,"_STANDARD_REQUIRED");
    bVar3 = cmGeneratorTarget::GetPropertyAsBool(target,&standard);
    std::__cxx11::string::~string((string *)&standard);
    if (bVar3) {
      std::operator+(&local_260,"CMAKE_",lang);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&optVec_2,
                     &local_260,pcVar5);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&optVec_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&optVec_2,
                     "_");
      std::operator+(&standard,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&optVec_1,
                     &type);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&optVec,
                     &standard,"_COMPILE_OPTION");
      std::__cxx11::string::~string((string *)&standard);
      std::__cxx11::string::~string((string *)&optVec_1);
      std::__cxx11::string::~string((string *)&optVec_2);
      std::__cxx11::string::~string((string *)&local_260);
      pcVar11 = cmMakefile::GetDefinition(target->Target->Makefile,(string *)&optVec);
      if (pcVar11 == (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&standard);
        poVar9 = std::operator<<((ostream *)&standard,"Target \"");
        psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(target);
        poVar9 = std::operator<<(poVar9,(string *)psVar10);
        poVar9 = std::operator<<(poVar9,"\" requires the language dialect \"");
        poVar9 = std::operator<<(poVar9,(string *)lang);
        poVar9 = std::operator<<(poVar9,pcVar5);
        poVar9 = std::operator<<(poVar9,"\" ");
        pcVar5 = "";
        if (bVar2) {
          pcVar5 = "(with compiler extensions)";
        }
        poVar9 = std::operator<<(poVar9,pcVar5);
        std::operator<<(poVar9,", but CMake does not know the compile flags to use to enable it.");
        std::__cxx11::stringbuf::str();
        IssueMessage(this,FATAL_ERROR,(string *)&optVec_1);
        std::__cxx11::string::~string((string *)&optVec_1);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&standard);
      }
      else {
        optVec_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        optVec_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        optVec_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string((string *)&standard,pcVar11,(allocator *)&optVec_2);
        cmSystemTools::ExpandListArgument(&standard,&optVec_1,false);
        std::__cxx11::string::~string((string *)&standard);
        lVar13 = 0;
        for (uVar14 = 0;
            uVar14 < (ulong)((long)optVec_1.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)optVec_1.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
            uVar14 = uVar14 + 1) {
          (*this->_vptr_cmLocalGenerator[8])
                    (this,local_268,
                     (long)&((optVec_1.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar13
                    );
          lVar13 = lVar13 + 0x20;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&optVec_1);
        psVar12 = (string *)&optVec;
      }
    }
    else {
      if ((AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
           ::langStdMap_abi_cxx11_ == '\0') &&
         (iVar4 = __cxa_guard_acquire(&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                       ::langStdMap_abi_cxx11_), iVar4 != 0)) {
        AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
        ::langStdMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
        ::langStdMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
        ::langStdMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
              ::langStdMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
        AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
        ::langStdMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
              ::langStdMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
        AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
        ::langStdMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        __cxa_atexit(std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::~map,&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                             ::langStdMap_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                             ::langStdMap_abi_cxx11_);
      }
      if (AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
          ::langStdMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        std::__cxx11::string::string((string *)&standard,"CXX",(allocator *)&optVec_1);
        pvVar6 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                               ::langStdMap_abi_cxx11_,&standard);
        std::__cxx11::string::string((string *)&optVec,"17",(allocator *)&optVec_2);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (pvVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &optVec);
        std::__cxx11::string::~string((string *)&optVec);
        std::__cxx11::string::~string((string *)&standard);
        std::__cxx11::string::string((string *)&standard,"CXX",(allocator *)&optVec_1);
        pvVar6 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                               ::langStdMap_abi_cxx11_,&standard);
        std::__cxx11::string::string((string *)&optVec,"14",(allocator *)&optVec_2);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (pvVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &optVec);
        std::__cxx11::string::~string((string *)&optVec);
        std::__cxx11::string::~string((string *)&standard);
        std::__cxx11::string::string((string *)&standard,"CXX",(allocator *)&optVec_1);
        pvVar6 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                               ::langStdMap_abi_cxx11_,&standard);
        std::__cxx11::string::string((string *)&optVec,"11",(allocator *)&optVec_2);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (pvVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &optVec);
        std::__cxx11::string::~string((string *)&optVec);
        std::__cxx11::string::~string((string *)&standard);
        std::__cxx11::string::string((string *)&standard,"CXX",(allocator *)&optVec_1);
        pvVar6 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                               ::langStdMap_abi_cxx11_,&standard);
        std::__cxx11::string::string((string *)&optVec,"98",(allocator *)&optVec_2);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (pvVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &optVec);
        std::__cxx11::string::~string((string *)&optVec);
        std::__cxx11::string::~string((string *)&standard);
        std::__cxx11::string::string((string *)&standard,"C",(allocator *)&optVec_1);
        pvVar6 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                               ::langStdMap_abi_cxx11_,&standard);
        std::__cxx11::string::string((string *)&optVec,"11",(allocator *)&optVec_2);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (pvVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &optVec);
        std::__cxx11::string::~string((string *)&optVec);
        std::__cxx11::string::~string((string *)&standard);
        std::__cxx11::string::string((string *)&standard,"C",(allocator *)&optVec_1);
        pvVar6 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                               ::langStdMap_abi_cxx11_,&standard);
        std::__cxx11::string::string((string *)&optVec,"99",(allocator *)&optVec_2);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (pvVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &optVec);
        std::__cxx11::string::~string((string *)&optVec);
        std::__cxx11::string::~string((string *)&standard);
        std::__cxx11::string::string((string *)&standard,"C",(allocator *)&optVec_1);
        pvVar6 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                               ::langStdMap_abi_cxx11_,&standard);
        std::__cxx11::string::string((string *)&optVec,"90",(allocator *)&optVec_2);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (pvVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &optVec);
        std::__cxx11::string::~string((string *)&optVec);
        std::__cxx11::string::~string((string *)&standard);
        std::__cxx11::string::string((string *)&standard,"CUDA",(allocator *)&optVec_1);
        pvVar6 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                               ::langStdMap_abi_cxx11_,&standard);
        std::__cxx11::string::string((string *)&optVec,"14",(allocator *)&optVec_2);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (pvVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &optVec);
        std::__cxx11::string::~string((string *)&optVec);
        std::__cxx11::string::~string((string *)&standard);
        std::__cxx11::string::string((string *)&standard,"CUDA",(allocator *)&optVec_1);
        pvVar6 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                               ::langStdMap_abi_cxx11_,&standard);
        std::__cxx11::string::string((string *)&optVec,"11",(allocator *)&optVec_2);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (pvVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &optVec);
        std::__cxx11::string::~string((string *)&optVec);
        std::__cxx11::string::~string((string *)&standard);
        std::__cxx11::string::string((string *)&standard,"CUDA",(allocator *)&optVec_1);
        pvVar6 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                               ::langStdMap_abi_cxx11_,&standard);
        std::__cxx11::string::string((string *)&optVec,"98",(allocator *)&optVec_2);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (pvVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &optVec);
        std::__cxx11::string::~string((string *)&optVec);
        std::__cxx11::string::~string((string *)&standard);
      }
      std::__cxx11::string::string((string *)&standard,pcVar5,(allocator *)&optVec);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                             ::langStdMap_abi_cxx11_,lang);
      __rhs = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        ((pmVar7->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,
                         (pmVar7->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish,&standard);
      pbVar1 = (pmVar7->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (__rhs._M_current == pbVar1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &optVec_2,lang,"_STANDARD is set to invalid value \'");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &optVec_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &optVec_2,&standard);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&optVec,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &optVec_1,"\'");
        std::__cxx11::string::~string((string *)&optVec_1);
        std::__cxx11::string::~string((string *)&optVec_2);
        this_01 = this->GlobalGenerator->CMakeInstance;
        cmGeneratorTarget::GetBacktrace((cmListFileBacktrace *)&optVec_1,target);
        cmake::IssueMessage(this_01,FATAL_ERROR,(string *)&optVec,(cmListFileBacktrace *)&optVec_1);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&optVec_1);
LAB_002b4e24:
        std::__cxx11::string::~string((string *)&optVec);
      }
      else {
        _Var8 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                          ((pmVar7->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,pbVar1,&defaultStd);
        if (_Var8._M_current ==
            (pmVar7->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          std::operator+(&local_260,"CMAKE_",lang);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &optVec_2,&local_260,"_STANDARD_DEFAULT is set to invalid value \'");
          std::__cxx11::string::string((string *)&local_210,defaultStd,&local_269);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &optVec_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &optVec_2,&local_210);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &optVec,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&optVec_1,"\'");
          std::__cxx11::string::~string((string *)&optVec_1);
          std::__cxx11::string::~string((string *)&local_210);
          std::__cxx11::string::~string((string *)&optVec_2);
          std::__cxx11::string::~string((string *)&local_260);
          IssueMessage(this,INTERNAL_ERROR,(string *)&optVec);
          goto LAB_002b4e24;
        }
        if (_Var8._M_current <= __rhs._M_current) {
          std::operator+(&local_210,"CMAKE_",lang);
          std::operator+(&local_260,&local_210,__rhs._M_current);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &optVec_2,&local_260,"_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &optVec_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &optVec_2,&type);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &optVec,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&optVec_1,"_COMPILE_OPTION");
          std::__cxx11::string::~string((string *)&optVec_1);
          std::__cxx11::string::~string((string *)&optVec_2);
          std::__cxx11::string::~string((string *)&local_260);
          std::__cxx11::string::~string((string *)&local_210);
          pcVar5 = cmMakefile::GetRequiredDefinition(target->Target->Makefile,(string *)&optVec);
          optVec_2.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          optVec_2.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          optVec_2.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::__cxx11::string::string((string *)&optVec_1,pcVar5,(allocator *)&local_260);
          cmSystemTools::ExpandListArgument((string *)&optVec_1,&optVec_2,false);
          std::__cxx11::string::~string((string *)&optVec_1);
          lVar13 = 0;
          for (uVar14 = 0;
              uVar14 < (ulong)((long)optVec_2.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)optVec_2.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar14 = uVar14 + 1) {
            (*this->_vptr_cmLocalGenerator[8])
                      (this,local_268,
                       (long)&((optVec_2.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar13);
            lVar13 = lVar13 + 0x20;
          }
LAB_002b4e1a:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&optVec_2);
          goto LAB_002b4e24;
        }
        local_1f0 = _Var8._M_current;
        for (; __rhs._M_current < local_1f0; __rhs._M_current = __rhs._M_current + 1) {
          std::operator+(&local_210,"CMAKE_",lang);
          std::operator+(&local_260,&local_210,__rhs._M_current);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &optVec_2,&local_260,"_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &optVec_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &optVec_2,&type);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &optVec,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&optVec_1,"_COMPILE_OPTION");
          std::__cxx11::string::~string((string *)&optVec_1);
          std::__cxx11::string::~string((string *)&optVec_2);
          std::__cxx11::string::~string((string *)&local_260);
          std::__cxx11::string::~string((string *)&local_210);
          pcVar5 = cmMakefile::GetDefinition(target->Target->Makefile,(string *)&optVec);
          if (pcVar5 != (char *)0x0) {
            optVec_2.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            optVec_2.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            optVec_2.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::__cxx11::string::string((string *)&optVec_1,pcVar5,(allocator *)&local_260);
            cmSystemTools::ExpandListArgument((string *)&optVec_1,&optVec_2,false);
            std::__cxx11::string::~string((string *)&optVec_1);
            lVar13 = 0;
            for (uVar14 = 0;
                uVar14 < (ulong)((long)optVec_2.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)optVec_2.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5);
                uVar14 = uVar14 + 1) {
              (*this->_vptr_cmLocalGenerator[8])
                        (this,local_268,
                         (long)&((optVec_2.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar13);
              lVar13 = lVar13 + 0x20;
            }
            goto LAB_002b4e1a;
          }
          std::__cxx11::string::~string((string *)&optVec);
        }
      }
      psVar12 = &standard;
    }
    std::__cxx11::string::~string((string *)psVar12);
    psVar12 = &type;
  }
  std::__cxx11::string::~string((string *)psVar12);
LAB_002b4e46:
  std::__cxx11::string::~string((string *)&stdProp);
  std::__cxx11::string::~string((string *)&extProp);
  return;
}

Assistant:

void cmLocalGenerator::AddCompilerRequirementFlag(
  std::string& flags, cmGeneratorTarget const* target, const std::string& lang)
{
  if (lang.empty()) {
    return;
  }
  const char* defaultStd =
    this->Makefile->GetDefinition("CMAKE_" + lang + "_STANDARD_DEFAULT");
  if (!defaultStd || !*defaultStd) {
    // This compiler has no notion of language standard levels.
    return;
  }
  std::string extProp = lang + "_EXTENSIONS";
  bool ext = true;
  if (const char* extPropValue = target->GetProperty(extProp)) {
    if (cmSystemTools::IsOff(extPropValue)) {
      ext = false;
    }
  }
  std::string stdProp = lang + "_STANDARD";
  const char* standardProp = target->GetProperty(stdProp);
  if (!standardProp) {
    if (ext) {
      // No language standard is specified and extensions are not disabled.
      // Check if this compiler needs a flag to enable extensions.
      std::string const option_flag =
        "CMAKE_" + lang + "_EXTENSION_COMPILE_OPTION";
      if (const char* opt =
            target->Target->GetMakefile()->GetDefinition(option_flag)) {
        std::vector<std::string> optVec;
        cmSystemTools::ExpandListArgument(opt, optVec);
        for (size_t i = 0; i < optVec.size(); ++i) {
          this->AppendFlagEscape(flags, optVec[i]);
        }
      }
    }
    return;
  }

  std::string const type = ext ? "EXTENSION" : "STANDARD";

  if (target->GetPropertyAsBool(lang + "_STANDARD_REQUIRED")) {
    std::string option_flag =
      "CMAKE_" + lang + standardProp + "_" + type + "_COMPILE_OPTION";

    const char* opt =
      target->Target->GetMakefile()->GetDefinition(option_flag);
    if (!opt) {
      std::ostringstream e;
      e << "Target \"" << target->GetName() << "\" requires the language "
                                               "dialect \""
        << lang << standardProp << "\" "
        << (ext ? "(with compiler extensions)" : "")
        << ", but CMake "
           "does not know the compile flags to use to enable it.";
      this->IssueMessage(cmake::FATAL_ERROR, e.str());
    } else {
      std::vector<std::string> optVec;
      cmSystemTools::ExpandListArgument(opt, optVec);
      for (size_t i = 0; i < optVec.size(); ++i) {
        this->AppendFlagEscape(flags, optVec[i]);
      }
    }
    return;
  }

  static std::map<std::string, std::vector<std::string> > langStdMap;
  if (langStdMap.empty()) {
    // Maintain sorted order, most recent first.
    langStdMap["CXX"].push_back("17");
    langStdMap["CXX"].push_back("14");
    langStdMap["CXX"].push_back("11");
    langStdMap["CXX"].push_back("98");

    langStdMap["C"].push_back("11");
    langStdMap["C"].push_back("99");
    langStdMap["C"].push_back("90");

    langStdMap["CUDA"].push_back("14");
    langStdMap["CUDA"].push_back("11");
    langStdMap["CUDA"].push_back("98");
  }

  std::string standard(standardProp);

  std::vector<std::string>& stds = langStdMap[lang];

  std::vector<std::string>::const_iterator stdIt =
    std::find(stds.begin(), stds.end(), standard);
  if (stdIt == stds.end()) {
    std::string e =
      lang + "_STANDARD is set to invalid value '" + standard + "'";
    this->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
      cmake::FATAL_ERROR, e, target->GetBacktrace());
    return;
  }

  std::vector<std::string>::const_iterator defaultStdIt =
    std::find(stds.begin(), stds.end(), defaultStd);
  if (defaultStdIt == stds.end()) {
    std::string e = "CMAKE_" + lang +
      "_STANDARD_DEFAULT is set to invalid value '" + std::string(defaultStd) +
      "'";
    this->IssueMessage(cmake::INTERNAL_ERROR, e);
    return;
  }

  // If the standard requested is older than the compiler's default
  // then we need to use a flag to change it.  The comparison is
  // greater-or-equal because the standards are stored in backward
  // chronological order.
  if (stdIt >= defaultStdIt) {
    std::string option_flag =
      "CMAKE_" + lang + *stdIt + "_" + type + "_COMPILE_OPTION";

    const char* opt =
      target->Target->GetMakefile()->GetRequiredDefinition(option_flag);
    std::vector<std::string> optVec;
    cmSystemTools::ExpandListArgument(opt, optVec);
    for (size_t i = 0; i < optVec.size(); ++i) {
      this->AppendFlagEscape(flags, optVec[i]);
    }
    return;
  }

  // The standard requested is at least as new as the compiler's default,
  // and the standard request is not required.  Decay to the newest standard
  // for which a flag is defined.
  for (; stdIt < defaultStdIt; ++stdIt) {
    std::string option_flag =
      "CMAKE_" + lang + *stdIt + "_" + type + "_COMPILE_OPTION";

    if (const char* opt =
          target->Target->GetMakefile()->GetDefinition(option_flag)) {
      std::vector<std::string> optVec;
      cmSystemTools::ExpandListArgument(opt, optVec);
      for (size_t i = 0; i < optVec.size(); ++i) {
        this->AppendFlagEscape(flags, optVec[i]);
      }
      return;
    }
  }
}